

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerUpdateNewScObjectCache
          (Lowerer *this,Instr *insertInstr,Opnd *dst,Opnd *src1,bool isCtorFunction)

{
  LowererMD *this_00;
  uint32 offset;
  LabelInstr *target;
  RegOpnd *this_01;
  RegOpnd *pRVar1;
  RegOpnd *pRVar2;
  IndirOpnd *pIVar3;
  IntConstOpnd *compareSrc2;
  BranchInstr *branchInstr;
  LabelInstr *instr;
  HelperCallOpnd *newSrc;
  Instr *this_02;
  Lowerer *pLVar4;
  undefined7 in_register_00000081;
  
  pLVar4 = (Lowerer *)0x176;
  target = IR::LabelInstr::New(Label,this->m_func,false);
  this_01 = GetRegOpnd(pLVar4,src1,insertInstr,this->m_func,TyInt64);
  if ((int)CONCAT71(in_register_00000081,isCtorFunction) == 0) {
    pRVar1 = IR::Opnd::AsRegOpnd(&this_01->super_Opnd);
    pRVar2 = IR::RegOpnd::New(TyInt64,this->m_func);
    pIVar3 = IR::IndirOpnd::New(pRVar1,8,TyInt64,this->m_func,false);
    InsertMove(&pRVar2->super_Opnd,&pIVar3->super_Opnd,insertInstr,true);
    offset = Js::Type::GetOffsetOfTypeId();
    pIVar3 = IR::IndirOpnd::New(pRVar2,offset,TyInt32,this->m_func,false);
    pLVar4 = (Lowerer *)0x1b;
    compareSrc2 = IR::IntConstOpnd::New(0x1b,TyInt32,this->m_func,true);
    branchInstr = InsertCompareBranch(pLVar4,&pIVar3->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,
                                      target,insertInstr,false);
    LowererMD::InsertObjectPoison(&pRVar1->super_Opnd,branchInstr,insertInstr,false);
  }
  pRVar1 = IR::RegOpnd::New(TyVar,this->m_func);
  pRVar2 = IR::Opnd::AsRegOpnd(&this_01->super_Opnd);
  pIVar3 = IR::IndirOpnd::New(pRVar2,0x20,TyInt64,this->m_func,false);
  InsertMove(&pRVar1->super_Opnd,&pIVar3->super_Opnd,insertInstr,true);
  pRVar2 = IR::RegOpnd::New(TyInt8,this->m_func);
  pIVar3 = IR::IndirOpnd::New(pRVar1,0x26,TyUint8,this->m_func,false);
  InsertMove(&pRVar2->super_Opnd,&pIVar3->super_Opnd,insertInstr,true);
  InsertTestBranch(&pRVar2->super_Opnd,&pRVar2->super_Opnd,BrEq_A,target,insertInstr);
  instr = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
  newSrc = IR::HelperCallOpnd::New(HelperUpdateNewScObjectCache,this->m_func);
  LoadScriptContext(this,insertInstr);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,insertInstr,dst);
  LowererMD::LoadHelperArgument(this_00,insertInstr,&this_01->super_Opnd);
  this_02 = IR::Instr::New(Call,this->m_func);
  IR::Instr::SetSrc1(this_02,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,this_02);
  LowererMD::LowerCall(this_00,this_02,0);
  IR::Instr::InsertBefore(insertInstr,&target->super_Instr);
  return insertInstr;
}

Assistant:

IR::Instr *
Lowerer::LowerUpdateNewScObjectCache(IR::Instr * insertInstr, IR::Opnd *dst, IR::Opnd *src1, const bool isCtorFunction)
{
    // if (!isCtorFunction)
    // {
    //     MOV r1, [src1 + offset(type)]       -- check base TypeIds_Function
    //     CMP [r1 + offset(typeId)], TypeIds_Function
    // }
    // JNE $fallThru
    // MOV r2, [src1 + offset(constructorCache)]
    // MOV r3, [r2 + offset(updateAfterCtor)]
    // TEST r3, r3                         -- check if updateAfterCtor is 0
    // JEQ $fallThru
    // CALL UpdateNewScObjectCache(src1, dst, scriptContext)
    // $fallThru:
    IR::LabelInstr *labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    src1 = GetRegOpnd(src1, insertInstr, m_func, TyMachReg);

    // Check if constructor is a function if we don't already know it.
    if (!isCtorFunction)
    {
        IR::RegOpnd* src1RegOpnd = src1->AsRegOpnd();
        //  MOV r1, [src1 + offset(type)]       -- check base TypeIds_Function
        IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src1RegOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
        Lowerer::InsertMove(r1, indirOpnd, insertInstr);

        // CMP [r1 + offset(typeId)], TypeIds_Function
        // JNE $fallThru
        indirOpnd = IR::IndirOpnd::New(r1, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func);
        IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, this->m_func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(indirOpnd, intOpnd, Js::OpCode::BrNeq_A, labelFallThru, insertInstr);
        InsertObjectPoison(src1RegOpnd, branchInstr, insertInstr, false);
    }

    // Every function has a constructor cache, even if only the default blank one.
    // r2 = MOV JavascriptFunction->constructorCache
    IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
    IR::IndirOpnd *opndIndir = IR::IndirOpnd::New(src1->AsRegOpnd(), Js::JavascriptFunction::GetOffsetOfConstructorCache(), TyMachReg, this->m_func);
    IR::Instr *instr = Lowerer::InsertMove(r2, opndIndir, insertInstr);

    // r3 = constructorCache->updateAfterCtor
    IR::RegOpnd *r3 = IR::RegOpnd::New(TyInt8, this->m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(r2, Js::ConstructorCache::GetOffsetOfUpdateAfterCtor(), TyUint8, this->m_func);
    instr = Lowerer::InsertMove(r3, indirOpnd, insertInstr);

    // TEST r3, r3                         -- check if updateAfterCtor is 0
    // JEQ $fallThru
    InsertTestBranch(r3, r3, Js::OpCode::BrEq_A, labelFallThru, insertInstr);

    // r2 = UpdateNewScObjectCache(src1, dst, scriptContext)
    insertInstr->InsertBefore(IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true)); // helper label for uncommon path
    IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperUpdateNewScObjectCache, m_func);

    LoadScriptContext(insertInstr);
    m_lowererMD.LoadHelperArgument(insertInstr, dst);
    m_lowererMD.LoadHelperArgument(insertInstr, src1);

    instr = IR::Instr::New(Js::OpCode::Call, m_func);
    instr->SetSrc1(opndHelper);
    insertInstr->InsertBefore(instr);
    m_lowererMD.LowerCall(instr, 0);

    // $fallThru:
    insertInstr->InsertBefore(labelFallThru);

    return insertInstr;
}